

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

char * Curl_checkProxyheaders(Curl_easy *data,connectdata *conn,char *thisheader,size_t thislen)

{
  int iVar1;
  curl_slist *local_40;
  curl_slist *local_38;
  curl_slist *head;
  size_t thislen_local;
  char *thisheader_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((*(uint *)&(conn->bits).field_0x4 >> 5 & 1) == 0) ||
     ((*(ulong *)&(data->set).field_0x8e2 >> 1 & 1) == 0)) {
    local_40 = (data->set).headers;
  }
  else {
    local_40 = (data->set).proxyheaders;
  }
  local_38 = local_40;
  while( true ) {
    if (local_38 == (curl_slist *)0x0) {
      return (char *)0x0;
    }
    iVar1 = Curl_strncasecompare(local_38->data,thisheader,thislen);
    if ((iVar1 != 0) && ((local_38->data[thislen] == ':' || (local_38->data[thislen] == ';'))))
    break;
    local_38 = local_38->next;
  }
  return local_38->data;
}

Assistant:

char *Curl_checkProxyheaders(struct Curl_easy *data,
                             const struct connectdata *conn,
                             const char *thisheader,
                             const size_t thislen)
{
  struct curl_slist *head;

  for(head = (conn->bits.proxy && data->set.sep_headers) ?
        data->set.proxyheaders : data->set.headers;
      head; head = head->next) {
    if(strncasecompare(head->data, thisheader, thislen) &&
       Curl_headersep(head->data[thislen]))
      return head->data;
  }

  return NULL;
}